

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void str_sanitize_strong(char *str_in)

{
  byte bVar1;
  
  for (; *str_in != 0; str_in = (char *)((byte *)str_in + 1)) {
    bVar1 = *str_in & 0x7f;
    if (bVar1 < 0x21) {
      bVar1 = 0x20;
    }
    *str_in = bVar1;
  }
  return;
}

Assistant:

void str_sanitize_strong(char *str_in)
{
	unsigned char *str = (unsigned char *)str_in;
	while(*str)
	{
		*str &= 0x7f;
		if(*str < 32)
			*str = 32;
		str++;
	}
}